

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall
leveldb::DBTest_EmptyValue_Test::DBTest_EmptyValue_Test(DBTest_EmptyValue_Test *this)

{
  DBTest_EmptyValue_Test *this_local;
  
  DBTest::DBTest(&this->super_DBTest);
  (this->super_DBTest).super_Test._vptr_Test = (_func_int **)&PTR__DBTest_EmptyValue_Test_00228600;
  return;
}

Assistant:

TEST_F(DBTest, EmptyValue) {
  do {
    ASSERT_LEVELDB_OK(Put("key", "v1"));
    ASSERT_EQ("v1", Get("key"));
    ASSERT_LEVELDB_OK(Put("key", ""));
    ASSERT_EQ("", Get("key"));
    ASSERT_LEVELDB_OK(Put("key", "v2"));
    ASSERT_EQ("v2", Get("key"));
  } while (ChangeOptions());
}